

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint32_t farmhashmk::Hash32WithSeed(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  if (0x18 < len) {
    uVar1 = Hash32Len13to24(s,0x18,(uint)len ^ seed);
    uVar2 = Hash32(s + 0x18,len - 0x18);
    uVar1 = util::Mur(seed + uVar2,uVar1);
    return uVar1;
  }
  if (0xc < len) {
    uVar1 = Hash32Len13to24(s,len,seed * -0x3361d2af);
    return uVar1;
  }
  if (4 < len) {
    uVar1 = Hash32Len5to12(s,len,seed);
    return uVar1;
  }
  uVar1 = Hash32Len0to4(s,len,seed);
  return uVar1;
}

Assistant:

uint32_t Hash32WithSeed(const char *s, size_t len, uint32_t seed) {
  if (len <= 24) {
    if (len >= 13) return Hash32Len13to24(s, len, seed * c1);
    else if (len >= 5) return Hash32Len5to12(s, len, seed);
    else return Hash32Len0to4(s, len, seed);
  }
  uint32_t h = Hash32Len13to24(s, 24, seed ^ len);
  return Mur(Hash32(s + 24, len - 24) + seed, h);
}